

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O2

void __thiscall
randomx::AssemblyGeneratorX86::h_ISMULH_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  ostream *poVar1;
  undefined1 *puVar2;
  
  this->registerUsage[instr->dst] = i;
  puVar2 = &this->field_0x10;
  poVar1 = std::operator<<((ostream *)puVar2,"\tmov rax, ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)instr->dst * 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\timul ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)instr->src * 8));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)puVar2,"\tmov ");
  poVar1 = std::operator<<(poVar1,*(char **)(regR + (ulong)instr->dst * 8));
  poVar1 = std::operator<<(poVar1,", rdx");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void AssemblyGeneratorX86::h_ISMULH_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
		asmCode << "\timul " << regR[instr.src] << std::endl;
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}